

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O1

time_t cab_dos_time(uchar *p)

{
  byte bVar1;
  time_t tVar2;
  tm_conflict ts;
  tm local_38;
  
  bVar1 = (byte)*(ushort *)(p + 2);
  local_38.tm_wday = 0;
  local_38.tm_yday = 0;
  local_38.tm_gmtoff = 0;
  local_38.tm_zone = (char *)0x0;
  local_38.tm_year = (p[1] >> 1) + 0x50;
  local_38.tm_mon = (*(ushort *)p >> 5 & 0xf) - 1;
  local_38._8_8_ = (ulong)CONCAT14(*p,(uint)(p[3] >> 3)) & 0x1fffffffff;
  local_38._0_8_ = (ulong)CONCAT24(*(ushort *)(p + 2) >> 5,(uint)bVar1 + (uint)bVar1) & 0x3f0000003e
  ;
  local_38.tm_isdst = -1;
  local_38._36_4_ = 0;
  tVar2 = mktime(&local_38);
  return tVar2;
}

Assistant:

static time_t
cab_dos_time(const unsigned char *p)
{
	int msTime, msDate;
	struct tm ts;

	msDate = archive_le16dec(p);
	msTime = archive_le16dec(p+2);

	memset(&ts, 0, sizeof(ts));
	ts.tm_year = ((msDate >> 9) & 0x7f) + 80;   /* Years since 1900. */
	ts.tm_mon = ((msDate >> 5) & 0x0f) - 1;     /* Month number.     */
	ts.tm_mday = msDate & 0x1f;		    /* Day of month.     */
	ts.tm_hour = (msTime >> 11) & 0x1f;
	ts.tm_min = (msTime >> 5) & 0x3f;
	ts.tm_sec = (msTime << 1) & 0x3e;
	ts.tm_isdst = -1;
	return (mktime(&ts));
}